

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mode5InterrogatorStatus.cpp
# Opt level: O1

void __thiscall
KDIS::DATA_TYPE::Mode5InterrogatorStatus::SetIFFMission(Mode5InterrogatorStatus *this,KUINT8 IFFM)

{
  KException *this_00;
  KString local_40;
  
  if (IFFM < 8) {
    (this->m_StatusUnion).m_ui8Status = (this->m_StatusUnion).m_ui8Status & 0xf8 | IFFM;
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"SetIFFMission","");
  KException::KException(this_00,&local_40,8);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void Mode5InterrogatorStatus::SetIFFMission(KUINT8 IFFM) noexcept(false)
{
	if( IFFM > 7 )throw KException( __FUNCTION__, INVALID_DATA );
	m_StatusUnion.m_ui8IffMis = IFFM;
}